

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O3

void unloadtags(void)

{
  tagtree tVar1;
  ctag *pcVar2;
  ctag *elm;
  
  tVar1.rbh_root = tags.rbh_root;
  if (tags.rbh_root != (ctag *)0x0) {
    do {
      elm = tVar1.rbh_root;
      tVar1.rbh_root = (elm->entry).rbe_left;
    } while (tVar1.rbh_root != (ctag *)0x0);
    do {
      pcVar2 = tagtree_RB_NEXT(elm);
      tagtree_RB_REMOVE(&tags,elm);
      free(elm->tag);
      free(elm);
      elm = pcVar2;
    } while (pcVar2 != (ctag *)0x0);
  }
  return;
}

Assistant:

void
unloadtags(void)
{
	struct ctag *var, *nxt;

	for (var = RB_MIN(tagtree, &tags); var != NULL; var = nxt) {
		nxt = RB_NEXT(tagtree, &tags, var);
		RB_REMOVE(tagtree, &tags, var);
		/* line parsed with fparseln needs to be freed */
		free(var->tag);
		free(var);
	}
}